

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O3

void dgrminer::find_addition_nodes_and_edges
               (AdjacencyListCrate *adjacency_list,
               vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
               *antecedent_pattern_edges_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_id_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_labels_ADDED,
               map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
               *from_pattern_id_to_adj_id_map,
               vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *adj_list_nodes,
               set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
               *sets_of_used_edges,
               set<int,_std::less<int>,_std::allocator<int>_> *nodes_occupied_by_antecedent,
               set<int,_std::less<int>,_std::allocator<int>_> *edges_occupied_by_antecedent,
               bool debug)

{
  pointer paVar1;
  mapped_type mVar2;
  int iVar3;
  _Base_ptr p_Var4;
  byte bVar5;
  ulong uVar6;
  pointer piVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  ulong uVar10;
  pointer piVar11;
  ulong uVar12;
  pointer piVar13;
  int iVar14;
  _Rb_tree_header *p_Var15;
  ulong uVar16;
  pointer piVar17;
  pointer paVar18;
  long lVar19;
  ulong uVar20;
  _Rb_tree_header *p_Var21;
  _Base_ptr p_Var22;
  _Rb_tree_header *p_Var23;
  bool bVar24;
  vector<int,_std::allocator<int>_> selected_ids_from_adj;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  maximal_set_of_edges;
  non_dummy_vertices_and_edges ndve;
  set<int,_std::less<int>,_std::allocator<int>_> set_of_non_dummy_vertices;
  vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
  edge_mapping_sets;
  set<int,_std::less<int>,_std::allocator<int>_> set_of_used_edges;
  uint local_220;
  int local_21c;
  vector<int,_std::allocator<int>_> local_218;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_200;
  vector<int,_std::allocator<int>_> *local_1f8;
  _Rb_tree_header *local_1f0;
  vector<int,_std::allocator<int>_> local_1e8;
  vector<bool,_std::allocator<bool>_> local_1c8;
  vector<int,_std::allocator<int>_> *local_1a0;
  int *local_198;
  ulong local_190;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *local_188;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  local_180;
  vector<bool,_std::allocator<bool>_> local_168;
  non_dummy_vertices_and_edges local_140;
  AdjacencyListCrate *local_e0;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *local_d8;
  pointer local_d0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c8;
  vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
  local_98;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> local_78 [8];
  undefined4 local_70 [2];
  undefined8 local_68;
  undefined4 *local_60;
  undefined4 *local_58;
  undefined8 local_50;
  vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
  local_48;
  
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_140.non_dummy_vertices._M_t._M_impl._0_4_ =
       local_140.non_dummy_vertices._M_t._M_impl._0_4_ & 0xffffff00;
  local_1f8 = antecedent_pattern_node_id_ADDED;
  local_1a0 = antecedent_pattern_node_labels_ADDED;
  local_188 = from_pattern_id_to_adj_id_map;
  local_e0 = adjacency_list;
  local_d8 = antecedent_pattern_edges_ADDED;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_168,
             ((long)(adj_list_nodes->
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(adj_list_nodes->
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
             (bool *)&local_140,(allocator_type *)&local_c8);
  local_140.non_dummy_vertices._M_t._M_impl._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_218,(iterator)0x0,(int *)&local_140);
  p_Var21 = &(nodes_occupied_by_antecedent->_M_t)._M_impl.super__Rb_tree_header;
  local_220 = 0;
  local_21c = 0;
  local_200 = adj_list_nodes;
  local_1f0 = p_Var21;
LAB_00110d25:
  do {
    uVar6 = (ulong)(int)local_220;
    if ((ulong)((long)(local_1a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(local_1a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar6) {
      piVar7 = (local_1f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((local_1f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
          ._M_finish != piVar7) {
        uVar6 = 0;
        do {
          mVar2 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6];
          local_140.non_dummy_vertices._M_t._M_impl._0_1_ = (char)piVar7[uVar6];
          pmVar8 = std::
                   map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                   operator[](local_188,(key_type_conflict *)&local_140);
          *pmVar8 = mVar2;
          uVar6 = uVar6 + 1;
          piVar7 = (local_1f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(local_1f8->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 2
                                ));
      }
      local_98.
      super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      find_addition_edges(local_e0,local_d8,local_188,
                          (int)((ulong)((long)(adj_list_nodes->
                                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(adj_list_nodes->
                                             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start) >> 2) *
                          -0x55555555,&local_98,edges_occupied_by_antecedent,debug);
      std::
      vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ::vector(&local_48,&local_98);
      find_maximal_subsets_of_pairs(&local_180,&local_48);
      std::
      vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ::~vector(&local_48);
      local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_c8._M_impl.super__Rb_tree_header._M_header;
      local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
      piVar7 = (local_1f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar11 = (local_1f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      piVar17 = piVar11;
      local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (piVar11 != piVar7) {
        lVar19 = 0;
        uVar6 = 0;
        do {
          uVar10 = uVar6 + 0x3f;
          if (-1 < (long)uVar6) {
            uVar10 = uVar6;
          }
          if ((local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p
               [((long)uVar10 >> 6) +
                ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)] >> (uVar6 & 0x3f)
              & 1) == 0) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_c8,(int *)((long)piVar7 + lVar19));
            piVar7 = (local_1f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            piVar11 = (local_1f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar6 = uVar6 + 1;
          lVar19 = lVar19 + 4;
          piVar17 = piVar7;
        } while (uVar6 < (ulong)((long)piVar11 - (long)piVar7 >> 2));
      }
      if (local_180.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_180.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar6 = 0;
        do {
          local_70[0] = 0;
          local_68 = 0;
          local_60 = local_70;
          local_50 = 0;
          piVar13 = local_180.
                    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar6].
                    super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_58 = local_60;
          if (local_180.
              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar6].
              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar13) {
            lVar19 = 0;
            uVar10 = 0;
            do {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>(local_78,(int *)((long)&piVar13->first + lVar19));
              uVar10 = uVar10 + 1;
              piVar13 = local_180.
                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar6].
                        super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              lVar19 = lVar19 + 8;
            } while (uVar10 < (ulong)((long)local_180.
                                            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar6].
                                            super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)piVar13 >> 3));
          }
          local_140.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          local_140.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_140.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_140.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header;
          local_140.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_140.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_140.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_140.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_140.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header;
          local_140.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_140.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_140.non_dummy_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_140.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_140.non_dummy_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          operator=((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )&local_140,&local_c8);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          operator=(&local_140.non_dummy_edges._M_t,
                    (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )local_78);
          std::
          _Rb_tree<dgrminer::non_dummy_vertices_and_edges,dgrminer::non_dummy_vertices_and_edges,std::_Identity<dgrminer::non_dummy_vertices_and_edges>,std::less<dgrminer::non_dummy_vertices_and_edges>,std::allocator<dgrminer::non_dummy_vertices_and_edges>>
          ::_M_insert_unique<dgrminer::non_dummy_vertices_and_edges_const&>
                    ((_Rb_tree<dgrminer::non_dummy_vertices_and_edges,dgrminer::non_dummy_vertices_and_edges,std::_Identity<dgrminer::non_dummy_vertices_and_edges>,std::less<dgrminer::non_dummy_vertices_and_edges>,std::allocator<dgrminer::non_dummy_vertices_and_edges>>
                      *)sets_of_used_edges,&local_140);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_140.non_dummy_edges._M_t);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )&local_140);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )local_78);
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)(((long)local_180.
                                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_180.
                                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x5555555555555555));
        piVar17 = (local_1f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar11 = (local_1f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      p_Var21 = local_1f0;
      if (piVar11 != piVar17) {
        uVar6 = (ulong)local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
        uVar10 = (ulong)local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e
        ;
        if (-1 < (long)uVar6) {
          uVar10 = uVar6;
        }
        if ((local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p
             [((long)uVar10 >> 6) + ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)
             ] >> (uVar6 & 0x3f) & 1) == 0) {
          uVar6 = (long)local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish[-2] - 1;
          iVar3 = (int)uVar6;
          iVar14 = iVar3 + 0x3f;
          if (-1 < iVar3) {
            iVar14 = iVar3;
          }
          bVar5 = (byte)uVar6 & 0x3f;
          local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [(long)(iVar14 >> 6) + ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
               local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p
               [(long)(iVar14 >> 6) +
                ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        else {
          local_21c = local_21c + -1;
        }
        bVar24 = local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
        local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset =
             local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset - 1;
        if (bVar24) {
          local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
          local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p =
               local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish.super__Bit_iterator_base._M_p + -1;
        }
        local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        local_220 = local_220 - 1;
        local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_c8);
      std::
      vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ::~vector(&local_180);
      std::
      vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ::~vector(&local_98);
      if (piVar11 == piVar17) goto LAB_0011155f;
      uVar6 = (ulong)(int)local_220;
    }
    local_198 = local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_190 = (ulong)local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6];
    paVar18 = (adj_list_nodes->
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar10 = ((long)(adj_list_nodes->
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar18 >> 2) *
             -0x5555555555555555;
    if (local_190 <= uVar10 && uVar10 - local_190 != 0) {
      p_Var4 = (nodes_occupied_by_antecedent->_M_t)._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      local_d0 = (local_1a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      uVar9 = local_190;
      do {
        paVar1 = paVar18 + uVar9;
        p_Var15 = p_Var21;
        p_Var23 = p_Var21;
        if (p_Var4 != (_Base_ptr)0x0) {
          iVar3 = paVar1->_M_elems[0];
          p_Var22 = p_Var4;
          do {
            if (iVar3 <= (int)*(size_t *)(p_Var22 + 1)) {
              p_Var21 = (_Rb_tree_header *)p_Var22;
            }
            p_Var22 = (&p_Var22->_M_left)[(int)*(size_t *)(p_Var22 + 1) < iVar3];
          } while (p_Var22 != (_Base_ptr)0x0);
          p_Var15 = local_1f0;
          p_Var23 = local_1f0;
          if ((p_Var21 != local_1f0) && (p_Var23 = p_Var21, iVar3 < (int)p_Var21->_M_node_count)) {
            p_Var23 = local_1f0;
          }
        }
        uVar12 = uVar9 + 0x3f;
        if (-1 < (long)uVar9) {
          uVar12 = uVar9;
        }
        uVar16 = 1L << ((byte)uVar9 & 0x3f);
        if (p_Var23 == p_Var15) {
          uVar20 = (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001);
          if (((local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [((long)uVar12 >> 6) + (uVar20 - 1)] & uVar16) == 0) &&
             (paVar1->_M_elems[2] == local_d0[uVar6])) {
            local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar6] = (int)uVar9 + 1;
            local_140.non_dummy_vertices._M_t._M_impl._0_4_ = 0;
            if (local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_218,
                         (iterator)
                         local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_140);
            }
            else {
              *local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0;
              local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            adj_list_nodes = local_200;
            std::vector<bool,_std::allocator<bool>_>::push_back(&local_1c8,false);
            paVar18 = (adj_list_nodes->
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar9;
            if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_1e8,
                         (iterator)
                         local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,paVar18->_M_elems);
            }
            else {
              *local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = paVar18->_M_elems[0];
              local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[((long)uVar12 >> 6) + (uVar20 - 1)] =
                 local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar12 >> 6) + (uVar20 - 1)] | uVar16;
            local_220 = local_220 + 1;
            p_Var21 = local_1f0;
            goto LAB_00111440;
          }
        }
        uVar9 = uVar9 + 1;
        p_Var21 = local_1f0;
      } while (uVar9 <= uVar10 && uVar10 - uVar9 != 0);
    }
    adj_list_nodes = local_200;
    if (local_190 <= uVar10) {
      local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = (int)uVar10 + 1;
      local_140.non_dummy_vertices._M_t._M_impl._0_4_ = 0;
      if (local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_218,
                   (iterator)
                   local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_140);
      }
      else {
        *local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = 0;
        local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      adj_list_nodes = local_200;
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_1c8,true);
      local_140.non_dummy_vertices._M_t._M_impl._0_4_ =
           (int)((ulong)((long)(adj_list_nodes->
                               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(adj_list_nodes->
                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 +
           local_21c;
      if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_1e8,
                   (iterator)
                   local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_140);
      }
      else {
        *local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_140.non_dummy_vertices._M_t._M_impl._0_4_;
        local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_21c = local_21c + 1;
      local_220 = local_220 + 1;
    }
LAB_00111440:
    if (0 < (int)local_220) {
      if ((ulong)(long)local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[local_220] <=
          (ulong)(((long)(adj_list_nodes->
                         super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(adj_list_nodes->
                         super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555))
      goto LAB_00110d25;
      uVar6 = (ulong)local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
      uVar10 = (ulong)local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e;
      if (-1 < (long)uVar6) {
        uVar10 = uVar6;
      }
      if ((local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p
           [((long)uVar10 >> 6) + ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           >> (uVar6 & 0x3f) & 1) == 0) {
        uVar6 = (long)local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish[-2] - 1;
        iVar3 = (int)uVar6;
        iVar14 = iVar3 + 0x3f;
        if (-1 < iVar3) {
          iVar14 = iVar3;
        }
        bVar5 = (byte)uVar6 & 0x3f;
        local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [(long)(iVar14 >> 6) + ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)(iVar14 >> 6) + ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)
             ] & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      else {
        local_21c = local_21c + -1;
      }
      bVar24 = local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish.super__Bit_iterator_base._M_offset == 0;
      local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset =
           local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset - 1;
      if (bVar24) {
        local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
        local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p =
             local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p + -1;
      }
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      local_220 = local_220 - 1;
      local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
    }
    if ((local_220 == 0) &&
       (local_220 = 0,
       (ulong)(((long)(adj_list_nodes->
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(adj_list_nodes->
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
       (ulong)(long)*local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start)) {
LAB_0011155f:
      if (local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
      }
      if (local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
      }
      if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void find_addition_nodes_and_edges(AdjacencyListCrate & adjacency_list, std::vector<std::array<int, PAT___SIZE>> & antecedent_pattern_edges_ADDED,
		std::vector<int> & antecedent_pattern_node_id_ADDED,
		std::vector<int> & antecedent_pattern_node_labels_ADDED,
		std::map<char, int> & from_pattern_id_to_adj_id_map,
		std::vector<std::array<int, ADJ_NODES___SIZE>> & adj_list_nodes,
		std::set<non_dummy_vertices_and_edges> & sets_of_used_edges,
		std::set<int> & nodes_occupied_by_antecedent, std::set<int> & edges_occupied_by_antecedent,
		bool debug)
	{
		// first, try to find the addition nodes:

		std::vector<int> selected_ids_from_adj; // which IDS of adj nodes correspond to those in antecedent_pattern_isolated_node_id
		std::vector<bool> is_the_used_node_dummy;
		std::vector<int> which_indices_should_be_used_next; // here we save the currently used indices for backtracking
		std::vector<bool> adjacency_nodes_are_used(adj_list_nodes.size(), false); // here we save which nodes from the adjacency list are already used

		int number_of_created_dummy_vertices = 0;

		int isolated_vertex_current_index_ADDED = 0; // we want to process the the first isolated vertex
		which_indices_should_be_used_next.push_back(0); // for the first isolated node, we want to start from the first node of adjacency list

		// DO DFS:
		while (true)
		{

			// if all isolated ADDITION nodes were mapped:
			if (antecedent_pattern_node_labels_ADDED.size() <= isolated_vertex_current_index_ADDED)
			{
				// we don't need to check whether there are no addition edges - we wouldn't get here from the outer function
				// process the addition edges:

				// CREATE MAPPING: PATTERN ANTECEDENT IDS -> selected_ids_from_adj
				for (size_t i = 0; i < antecedent_pattern_node_id_ADDED.size(); i++)
				{
					from_pattern_id_to_adj_id_map[antecedent_pattern_node_id_ADDED[i]] = selected_ids_from_adj[i];
				}
				// FINALLY, FIND MAPPING OF ADDITION EDGES:
				std::vector<std::set<int_pair>> edge_mapping_sets;
				find_addition_edges(adjacency_list, antecedent_pattern_edges_ADDED, from_pattern_id_to_adj_id_map,
					adj_list_nodes.size(), edge_mapping_sets, edges_occupied_by_antecedent, debug);

				std::vector<std::vector<int_pair>> maximal_set_of_edges = find_maximal_subsets_of_pairs(edge_mapping_sets);

				// get the set of non_dummy_vertices:
				std::set<int> set_of_non_dummy_vertices;
				for (size_t i = 0; i < antecedent_pattern_node_id_ADDED.size(); i++)
				{
					if (!is_the_used_node_dummy[i])
					{
						set_of_non_dummy_vertices.insert(antecedent_pattern_node_id_ADDED[i]);
					}
				}

				// SAVE the used pattern edges to a set
				for (size_t i = 0; i < maximal_set_of_edges.size(); i++)
				{
					std::set<int> set_of_used_edges;
					for (size_t j = 0; j < maximal_set_of_edges[i].size(); j++)
					{
						set_of_used_edges.insert(maximal_set_of_edges[i][j].first);
					}
					non_dummy_vertices_and_edges ndve;
					ndve.non_dummy_vertices = set_of_non_dummy_vertices;
					ndve.non_dummy_edges = set_of_used_edges;

					sets_of_used_edges.insert(ndve);
				}

				// if there were no ADDITION ISOLATED NODES, just finish the DFS:
				if (antecedent_pattern_node_id_ADDED.size() == 0) {
					break;
				}

				// else BACKTRACK:

				bool was_the_node_dummy = is_the_used_node_dummy.back();
				which_indices_should_be_used_next.pop_back();

				if (was_the_node_dummy)
				{
					number_of_created_dummy_vertices--;
				}
				else
				{
					adjacency_nodes_are_used[which_indices_should_be_used_next.back() - 1] = false;
				}
				is_the_used_node_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				isolated_vertex_current_index_ADDED--;

			}
            // Nodes were not matched yet

			bool should_try_dummy = true;
			// try to find matching addition node:
			int node_candidate_index = which_indices_should_be_used_next[isolated_vertex_current_index_ADDED];
			for (; node_candidate_index < adj_list_nodes.size(); node_candidate_index++)
			{
				bool is_occupied_by_frequent_pattern = nodes_occupied_by_antecedent.find(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]) != nodes_occupied_by_antecedent.end();
				// if the current adjacency node wasn't used yet:
				if (!adjacency_nodes_are_used[node_candidate_index] && !is_occupied_by_frequent_pattern)
				{
					// if it is same as that isolated vertex:
					// (we must take the antecedent info of both nodes)
					bool are_same = adj_list_nodes[node_candidate_index][ADJ_NODES_LABEL] == antecedent_pattern_node_labels_ADDED[isolated_vertex_current_index_ADDED];

					if (are_same)
					{
						//if (debug) cout << "Found node match: " << isolated_vertex_current_index_ADDED <<
						//	"-th addition vertex to adj. vertex with ID: " << adj_list_nodes[node_candidate_index][ADJ_NODES_ID] << endl;
						//cout << "DOING FINDING MATCHING: " << endl;

						should_try_dummy = false;
						which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] = node_candidate_index + 1;
						which_indices_should_be_used_next.push_back(0);
						is_the_used_node_dummy.push_back(false);
						selected_ids_from_adj.push_back(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]);

						adjacency_nodes_are_used[node_candidate_index] = true;
						isolated_vertex_current_index_ADDED++;
						break;
					}
				}
			}
			// if we tried all regular nodes and should backtrack, try to map to a dummy vertex first:
			if (should_try_dummy && which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] <= adj_list_nodes.size())
			{
				//if (debug) cout << "Matching " << isolated_vertex_current_index_ADDED <<
				//	"-th addition vertex to a new dummy vertex with ID: " << (adj_list_nodes.size() + number_of_created_dummy_vertices) << endl;

				which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] = adj_list_nodes.size() + 1; // just mark there the size + 1
				which_indices_should_be_used_next.push_back(0);
				is_the_used_node_dummy.push_back(true);
				// selected_ids_from_adj.push_back(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]);
				//mark down the new ID of the dummy:
				//cout << "USING adj_list_nodes.size() = " << adj_list_nodes.size() << ", number_of_created_dummy_vertices = " << number_of_created_dummy_vertices << endl;

				selected_ids_from_adj.push_back(adj_list_nodes.size() + number_of_created_dummy_vertices);
				number_of_created_dummy_vertices++;
				isolated_vertex_current_index_ADDED++;
			}


			if (isolated_vertex_current_index_ADDED > 0 && which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] > adj_list_nodes.size())
			{
				// BACKTRACK:
				// now we also tried the dummy one, so really backtrack

				bool was_the_node_dummy = is_the_used_node_dummy.back();

				which_indices_should_be_used_next.pop_back();
				if (was_the_node_dummy)
				{
					number_of_created_dummy_vertices--;
				}
				else
				{
					adjacency_nodes_are_used[which_indices_should_be_used_next.back() - 1] = false;
				}

				//cout << "DOING FINAL BACKTRACK: " << endl;

				is_the_used_node_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				isolated_vertex_current_index_ADDED--;
			}

			if (isolated_vertex_current_index_ADDED == 0 && which_indices_should_be_used_next[isolated_vertex_current_index_ADDED] > adj_list_nodes.size())
			{
				// we tried all combinations, just end:
				break;
			}
		}
	}